

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

bool __thiscall
QOpenGLProgramBinaryCache::verifyHeader(QOpenGLProgramBinaryCache *this,QByteArray *buf)

{
  int *piVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(buf->d).size < 0x10) {
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) {
LAB_004d93c7:
      bVar2 = false;
      goto LAB_004d93c9;
    }
    local_18 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    pcVar3 = "Cached size too small";
  }
  else {
    piVar1 = (int *)(buf->d).ptr;
    if (piVar1 == (int *)0x0) {
      piVar1 = (int *)&QByteArray::_empty;
    }
    if (*piVar1 == 0x5174) {
      if (piVar1[1] == 3) {
        if (piVar1[2] == 0x60a00) {
          bVar2 = true;
          if (piVar1[3] == 8) goto LAB_004d93c9;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) == 0) goto LAB_004d93c7;
          local_18 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          pcVar3 = "Architecture does not match";
        }
        else {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) == 0) goto LAB_004d93c7;
          local_18 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          pcVar3 = "Qt version does not match";
        }
      }
      else {
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) == 0) goto LAB_004d93c7;
        local_18 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        pcVar3 = "Version does not match";
      }
    }
    else {
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) == 0) goto LAB_004d93c7;
      local_18 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
      pcVar3 = "Magic does not match";
    }
  }
  local_30[0x14] = '\0';
  local_30[0x15] = '\0';
  local_30[0x16] = '\0';
  local_30[0x17] = '\0';
  local_30[0xc] = '\0';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\0';
  local_30[0x10] = '\0';
  local_30[0x11] = '\0';
  local_30[0x12] = '\0';
  local_30[0x13] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[10] = '\0';
  local_30[0xb] = '\0';
  local_30[0] = '\x02';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  bVar2 = false;
  QtPrivateLogging::lcOpenGLProgramDiskCache::category.name = local_18;
  QMessageLogger::debug(local_30,pcVar3);
LAB_004d93c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLProgramBinaryCache::verifyHeader(const QByteArray &buf) const
{
    if (buf.size() < BASE_HEADER_SIZE) {
        qCDebug(lcOpenGLProgramDiskCache, "Cached size too small");
        return false;
    }
    const uchar *p = reinterpret_cast<const uchar *>(buf.constData());
    if (readUInt(&p) != BINSHADER_MAGIC) {
        qCDebug(lcOpenGLProgramDiskCache, "Magic does not match");
        return false;
    }
    if (readUInt(&p) != BINSHADER_VERSION) {
        qCDebug(lcOpenGLProgramDiskCache, "Version does not match");
        return false;
    }
    if (readUInt(&p) != BINSHADER_QTVERSION) {
        qCDebug(lcOpenGLProgramDiskCache, "Qt version does not match");
        return false;
    }
    if (readUInt(&p) != sizeof(quintptr)) {
        qCDebug(lcOpenGLProgramDiskCache, "Architecture does not match");
        return false;
    }
    return true;
}